

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableSetColumnWidth(ImGuiTable *table,ImGuiTableColumn *column_0,float column_0_width)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  ImGuiTableColumn *pIVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  
  fVar9 = (GImGui->Style).FramePadding.x * 3.0;
  if ((table->Flags & 0x100000) == 0) {
    fVar8 = ((table->WorkRect).Max.x - column_0->MinX) -
            (float)(~(int)column_0->IndexWithinVisibleSet + table->ColumnsVisibleCount) * fVar9;
  }
  else {
    fVar8 = 3.4028235e+38;
  }
  if (column_0_width <= fVar8) {
    fVar8 = column_0_width;
  }
  fVar8 = (float)(-(uint)(column_0_width < fVar9) & (uint)fVar9 |
                 ~-(uint)(column_0_width < fVar9) & (uint)fVar8);
  if ((column_0->WidthGiven != fVar8) || (NAN(column_0->WidthGiven) || NAN(fVar8))) {
    if ((column_0->WidthRequest != fVar8) || (NAN(column_0->WidthRequest) || NAN(fVar8))) {
      if ((long)column_0->NextVisibleColumn == -1) {
        pIVar6 = (ImGuiTableColumn *)0x0;
      }
      else {
        pIVar6 = (table->Columns).Data + column_0->NextVisibleColumn;
        if ((table->Columns).DataEnd <= pIVar6) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
      }
      table->IsSettingsDirty = true;
      if ((column_0->Flags & 4U) == 0) {
        if ((column_0->Flags & 8U) != 0) {
          if ((pIVar6 == (ImGuiTableColumn *)0x0) || ((pIVar6->Flags & 4) == 0)) {
            fVar1 = pIVar6->WidthRequest;
            fVar2 = column_0->WidthRequest;
            fVar8 = fVar1 - (fVar8 - fVar2);
            uVar7 = -(uint)(fVar9 <= fVar8);
            fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
            pIVar6->WidthRequest = fVar9;
            column_0->WidthRequest = (fVar1 + fVar2) - fVar9;
            if (table->LeftMostStretchedColumnDisplayOrder == -1) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                          ,0x2343,"TableUpdateColumnsWeightFromWidth","ImGui ASSERT FAILED: %s",
                          "table->LeftMostStretchedColumnDisplayOrder != -1");
            }
            if (table->ColumnsCount < 1) {
              local_58 = (undefined1  [8])0x0;
            }
            else {
              _local_58 = ZEXT816(0);
              lVar4 = 0;
              lVar5 = 0;
              do {
                pIVar6 = (table->Columns).Data;
                if ((table->Columns).DataEnd <=
                    (ImGuiTableColumn *)((long)&(pIVar6->ClipRect).Min.x + lVar4)) {
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                              ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
                }
                if (((&pIVar6->IsVisible)[lVar4] == true) &&
                   ((*(byte *)((long)&pIVar6->Flags + lVar4) & 8) != 0)) {
                  uVar3 = *(undefined8 *)((long)&pIVar6->WidthStretchWeight + lVar4);
                  local_58._4_4_ = (float)local_58._4_4_ + (float)((ulong)uVar3 >> 0x20);
                  local_58._0_4_ = (float)local_58._0_4_ + (float)uVar3;
                  fStack_50 = fStack_50 + 0.0;
                  fStack_4c = fStack_4c + 0.0;
                }
                lVar5 = lVar5 + 1;
                lVar4 = lVar4 + 0x68;
              } while (lVar5 < table->ColumnsCount);
            }
            if (((float)local_58._0_4_ <= 0.0) || ((float)local_58._4_4_ <= 0.0)) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                          ,0x2350,"TableUpdateColumnsWeightFromWidth","ImGui ASSERT FAILED: %s",
                          "visible_weight > 0.0f && visible_width > 0.0f");
            }
            if (0 < table->ColumnsCount) {
              lVar4 = 0;
              lVar5 = 0;
              do {
                pIVar6 = (table->Columns).Data;
                if ((table->Columns).DataEnd <=
                    (ImGuiTableColumn *)((long)&(pIVar6->ClipRect).Min.x + lVar4)) {
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                              ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
                }
                if (((&pIVar6->IsVisible)[lVar4] == true) &&
                   ((*(byte *)((long)&pIVar6->Flags + lVar4) & 8) != 0)) {
                  *(float *)((long)&pIVar6->WidthStretchWeight + lVar4) =
                       ((*(float *)((long)&pIVar6->WidthRequest + lVar4) + 0.0) /
                       (float)local_58._4_4_) * (float)local_58._0_4_;
                }
                lVar5 = lVar5 + 1;
                lVar4 = lVar4 + 0x68;
              } while (lVar5 < table->ColumnsCount);
            }
          }
          else {
            fVar8 = (column_0->WidthGiven - fVar8) + pIVar6->WidthGiven;
            uVar7 = -(uint)(fVar8 <= fVar9);
            pIVar6->WidthRequest = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)fVar8);
          }
        }
      }
      else {
        if ((((pIVar6 != (ImGuiTableColumn *)0x0) && ((pIVar6->Flags & 4) != 0)) &&
            (table->LeftMostStretchedColumnDisplayOrder != -1)) &&
           (table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)) {
          fVar8 = pIVar6->WidthRequest - (fVar8 - column_0->WidthRequest);
          uVar7 = -(uint)(fVar9 <= fVar8);
          fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
          fVar8 = (pIVar6->WidthRequest + column_0->WidthRequest) - fVar9;
          pIVar6->WidthRequest = fVar9;
        }
        column_0->WidthRequest = fVar8;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(ImGuiTable* table, ImGuiTableColumn* column_0, float column_0_width)
{
    // Constraints
    float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // [Resize Rule 2]
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
        {
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
            return;
        }

        // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
        float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
        column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
        column_1->WidthRequest = column_1_width;
        column_0->WidthRequest = column_0_width;
        TableUpdateColumnsWeightFromWidth(table);
    }
}